

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcGenTarg::close_method
          (CTcGenTarg *this,int local_cnt,CTcPrsSymtab *local_symtab,CTcTokFileDesc *end_desc,
          long end_linenum,tct3_method_gen_ctx *ctx,CTcNamedArgTab *named_arg_tab_head)

{
  CTcDataStream *this_00;
  int iVar1;
  ulong uVar2;
  CTcT3ExcTable *this_01;
  size_t sVar3;
  CTcTokFileDesc *in_RDX;
  undefined4 in_ESI;
  CTcGenTarg *in_RDI;
  undefined8 *in_R9;
  long in_stack_00000008;
  CTcPrsSymtab *t;
  CTcNamedArgTab *nt;
  CTcCodeStream *stream;
  uchar in_stack_0000007f;
  long in_stack_ffffffffffffff90;
  uint uVar4;
  CTcTokFileDesc *in_stack_ffffffffffffff98;
  CTcGenTarg *in_stack_ffffffffffffffa0;
  CTcDataStream *this_02;
  CTcTokFileDesc *local_48;
  long local_40;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (CTcDataStream *)*in_R9;
  iVar1 = can_skip_op(in_RDI);
  if (iVar1 == 0) {
    add_line_rec(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    iVar1 = is_in_constructor(in_RDI);
    if (iVar1 == 0) {
      write_op((CTcGenTarg *)named_arg_tab_head,in_stack_0000007f);
    }
    else {
      write_op((CTcGenTarg *)named_arg_tab_head,in_stack_0000007f);
      write_op((CTcGenTarg *)named_arg_tab_head,in_stack_0000007f);
    }
  }
  for (local_40 = in_stack_00000008; uVar4 = (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20),
      local_40 != 0; local_40 = *(long *)(local_40 + 0x18)) {
    CTcNamedArgTab::generate((CTcNamedArgTab *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  CTcCodeStream::release_labels((CTcCodeStream *)in_stack_ffffffffffffffa0);
  iVar1 = CTcMain::get_error_count(G_tcmain);
  if (iVar1 == 0) {
    remove_jumps_to_jumps((CTcGenTarg *)stream,(CTcCodeStream *)nt,(ulong)t);
  }
  uVar2 = CTcDataStream::get_ofs(this_00);
  in_R9[4] = uVar2;
  CTcDataStream::write2_at
            ((CTcDataStream *)in_stack_ffffffffffffffa0,(ulong)in_stack_ffffffffffffff98,uVar4);
  this_02 = this_00;
  get_max_sp_depth(in_RDI);
  CTcDataStream::write2_at(this_02,(ulong)in_stack_ffffffffffffff98,uVar4);
  for (local_48 = in_RDX; local_48 != (CTcTokFileDesc *)0x0;
      local_48 = (CTcTokFileDesc *)CTcPrsSymtab::get_parent((CTcPrsSymtab *)local_48)) {
    in_stack_ffffffffffffff98 = local_48;
    uVar2 = CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    CTcPrsSymtab::add_to_range((CTcPrsSymtab *)in_stack_ffffffffffffff98,(int)uVar2 - (int)in_R9[2])
    ;
  }
  this_01 = get_exc_table(in_RDI);
  sVar3 = CTcT3ExcTable::get_entry_count(this_01);
  if (sVar3 != 0) {
    uVar4 = (uint)((ulong)(in_R9[2] + 6) >> 0x20);
    CTcDataStream::get_ofs(this_00);
    CTcDataStream::write2_at(this_02,(ulong)in_stack_ffffffffffffff98,uVar4);
    get_exc_table(in_RDI);
    CTcT3ExcTable::write_to_code_stream((CTcT3ExcTable *)this_02);
  }
  return;
}

Assistant:

void CTcGenTarg::close_method(int local_cnt,
                              CTcPrsSymtab *local_symtab,
                              CTcTokFileDesc *end_desc, long end_linenum,
                              tct3_method_gen_ctx *ctx,
                              CTcNamedArgTab *named_arg_tab_head)
{
    /* get the output code stream from the context */
    CTcCodeStream *stream = ctx->stream;
    
    /* 
     *   Generate a 'return' opcode with a default 'nil' return value - this
     *   will ensure that code that reaches the end of the procedure returns
     *   normally.  If this is a constructor, return the 'self' object rather
     *   than nil.
     *   
     *   We only need to generate this epilogue if the next instruction would
     *   be reachable.  If it's not reachable, then the code explicitly took
     *   care of all types of exits.  
     */
    if (!can_skip_op())
    {
        /* 
         *   add a line record for the implied return at the last source line
         *   of the code body 
         */
        add_line_rec(end_desc, end_linenum);

        /* write the appropriate return */
        if (is_in_constructor())
        {
            /* we're in a constructor - return 'self' */
            write_op(OPC_PUSHSELF);
            write_op(OPC_RETVAL);
        }
        else
        {
            /* 
             *   Normal method/function - return without a value (explicitly
             *   set R0 to nil, though, so we don't return something returned
             *   from a called function).  
             */
            write_op(OPC_RETNIL);
        }
    }

    /* generate any named argument tables */
    for (CTcNamedArgTab *nt = named_arg_tab_head ; nt != 0 ; nt = nt->nxt)
        nt->generate();

    /* 
     *   release labels allocated for the code block; this will log an error
     *   if any labels are undefined 
     */
    stream->release_labels();

    /* 
     *   Eliminate jump-to-jump sequences in the generated code.  Don't
     *   bother if we've found any errors, as the generated code will not
     *   necessarily be valid if this is the case.  
     */
    if (G_tcmain->get_error_count() == 0)
        remove_jumps_to_jumps(stream, ctx->code_start_ofs);

    /* note the code block's end point */
    ctx->code_end_ofs = stream->get_ofs();

    /*
     *   Fix up the local variable count in the function header.  We might
     *   allocate extra locals for internal use while generating code, so we
     *   must wait until after generating our code before we know the final
     *   local count.  
     */
    stream->write2_at(ctx->method_ofs + 2, local_cnt);

    /* 
     *   Fix up the total stack space indicator in the function header.  The
     *   total stack size must include the locals, as well as stack space
     *   needed for intermediate computations.  
     */
    stream->write2_at(ctx->method_ofs + 4, get_max_sp_depth() + local_cnt);

    /*
     *   Before writing the exception table, mark the endpoint of the range
     *   of the main local scope and any enclosing scopes.  
     */
    for (CTcPrsSymtab *t = local_symtab ; t != 0 ; t = t->get_parent())
        t->add_to_range(G_cs->get_ofs() - ctx->method_ofs);

    /* 
     *   Generate the exception table, if we have one.  If we have no
     *   exception records, leave the exception table offset set to zero to
     *   indicate that there is no exception table for the method.  
     */
    if (get_exc_table()->get_entry_count() != 0)
    {
        /* 
         *   write the exception table offset - it's at the current offset in
         *   the code 
         */
        stream->write2_at(ctx->method_ofs + 6,
                          stream->get_ofs() - ctx->method_ofs);

        /* write the table */
        get_exc_table()->write_to_code_stream();
    }
}